

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResonanceChannels.test.cpp
# Opt level: O2

void verifyChunk(ResonanceChannels *chunk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  range_reference_t<D<true>_> rVar4;
  long lVar5;
  range_reference_t<D<true>_>_conflict pdVar6;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  double local_100;
  AssertionHandler catchAssertionHandler;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  base_range_t local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  undefined1 local_78 [8];
  bool local_70;
  bool bStack_6f;
  undefined2 uStack_6e;
  undefined4 uStack_6c;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  WithinRelMatcher *local_60;
  ulong local_58;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb3;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x1c;
  capturedExpression.m_start = "0.5, WithinRel( chunk.AJ() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_b0,capturedExpression,
             ContinueOnFailure);
  local_50._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_b0,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_6f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_b0,(double *)&local_50);
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c92f0;
  local_68._M_current = (double *)&local_50;
  local_60 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb4;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x1e;
  capturedExpression_00.m_start = "0.5, WithinRel( chunk.spin() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_b0,capturedExpression_00,
             ContinueOnFailure);
  local_50._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_b0,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_6f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_b0,(double *)&local_50);
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c92f0;
  local_68._M_current = (double *)&local_50;
  local_60 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb5;
  macroName_01.m_size = 10;
  macroName_01.m_start = "CHECK_THAT";
  capturedExpression_01.m_size = 0x1b;
  capturedExpression_01.m_start = "0., WithinRel( chunk.PJ() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_b0,capturedExpression_01,
             ContinueOnFailure);
  local_50._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_b0,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bStack_6f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_b0,(double *)&local_50);
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c92f0;
  local_68._M_current = (double *)&local_50;
  local_60 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb6;
  macroName_02.m_size = 10;
  macroName_02.m_start = "CHECK_THAT";
  capturedExpression_02.m_size = 0x1f;
  capturedExpression_02.m_start = "0., WithinRel( chunk.parity() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_b0,capturedExpression_02,
             ContinueOnFailure);
  local_50._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_b0,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bStack_6f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_b0,(double *)&local_50);
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c92f0;
  local_68._M_current = (double *)&local_50;
  local_60 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb7;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x10;
  capturedExpression_03.m_start = "0 == chunk.KBK()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_b0,capturedExpression_03,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_a8._1_1_ = local_98[0]._8_8_ == 0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_a8 = local_a8 & 0xffffffff;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb8;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x25;
  capturedExpression_04.m_start = "0 == chunk.numberBackgroundChannels()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_b0,capturedExpression_04,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_a8._1_1_ = local_98[0]._8_8_ == 0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_a8 = local_a8 & 0xffffffff;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xb9;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "0 == chunk.KPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_b0,capturedExpression_05,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(chunk->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_a8._1_1_ = local_98[0]._8_8_ == 0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_a8 = local_a8 & 0xffffffff;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xba;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1d;
  capturedExpression_06.m_start = "0 == chunk.phaseShiftOption()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_b0,capturedExpression_06,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(chunk->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_a8._1_1_ = local_98[0]._8_8_ == 0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_a8 = local_a8 & 0xffffffff;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xbb;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x10;
  capturedExpression_07.m_start = "2 == chunk.NCH()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_b0,capturedExpression_07,
             ContinueOnFailure);
  lVar5 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  auVar1._8_8_ = lVar5 >> 0x3f;
  auVar1._0_8_ = lVar5 >> 3;
  iVar3 = SUB164(auVar1 / SEXT816(6),0);
  local_a8._1_1_ = iVar3 == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9370;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  local_98[0]._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xbc;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1b;
  capturedExpression_08.m_start = "2 == chunk.numberChannels()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_b0,capturedExpression_08,
             ContinueOnFailure);
  lVar5 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  auVar2._8_8_ = lVar5 >> 0x3f;
  auVar2._0_8_ = lVar5 >> 3;
  local_98[0]._8_4_ = SUB164(auVar2 / SEXT816(6),0);
  local_a8._1_1_ = local_98[0]._8_4_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9370;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xbe;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x17;
  capturedExpression_09.m_start = "2 == chunk.PPI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_b0,capturedExpression_09,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::PPI
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>
              *)local_b0,chunk);
  local_58 = ((local_98[0]._M_allocated_capacity +
              ((long)((local_a0.rng_)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((local_a0.rng_)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3)) - 1U) / (ulong)local_98[0]._0_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  uStack_6c = 2;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xbf;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x27;
  capturedExpression_10.m_start = "2 == chunk.particlePairNumbers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_b0,capturedExpression_10,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::PPI
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>
              *)local_b0,chunk);
  local_58 = ((local_98[0]._M_allocated_capacity +
              ((long)((local_a0.rng_)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((local_a0.rng_)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3)) - 1U) / (ulong)local_98[0]._0_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  uStack_6c = 2;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc0;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x15;
  capturedExpression_11.m_start = "2 == chunk.L().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_b0,capturedExpression_11,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::L
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0.rng_ - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  uStack_6c = 2;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc1;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x29;
  capturedExpression_12.m_start = "2 == chunk.orbitalMomentumValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_b0,capturedExpression_12,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::L
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>
              *)local_b0,chunk);
  local_58 = ((((long)local_a0.rng_ - local_98[0]._0_8_ >> 3) + local_98[0]._8_8_) - 1U) /
             (ulong)local_98[0]._8_8_;
  bStack_6f = local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  uStack_6c = 2;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc2;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x17;
  capturedExpression_13.m_start = "2 == chunk.SCH().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_b0,capturedExpression_13,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::SCH
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc3;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x25;
  capturedExpression_14.m_start = "2 == chunk.channelSpinValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_b0,capturedExpression_14,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::SCH
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc4;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x17;
  capturedExpression_15.m_start = "2 == chunk.BND().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_b0,capturedExpression_15,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::BND
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc5;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x2b;
  capturedExpression_16.m_start = "2 == chunk.boundaryConditionValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_b0,capturedExpression_16,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::BND
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc6;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x17;
  capturedExpression_17.m_start = "2 == chunk.APT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_b0,capturedExpression_17,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APT
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc7;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x24;
  capturedExpression_18.m_start = "2 == chunk.trueChannelRadii().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_b0,capturedExpression_18,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APT
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc8;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x17;
  capturedExpression_19.m_start = "2 == chunk.APE().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_b0,capturedExpression_19,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APE
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xc9;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x29;
  capturedExpression_20.m_start = "2 == chunk.effectiveChannelRadii().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_b0,capturedExpression_20,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APE
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  local_98[0]._8_8_ =
       (((CONCAT44(uStack_6c,CONCAT22(uStack_6e,CONCAT11(bStack_6f,local_70))) -
          (long)local_68._M_current >> 3) + (long)local_60) - 1U) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93b0;
  local_a8._4_4_ = 2;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xcb;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x13;
  capturedExpression_21.m_start = "1 == chunk.PPI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_b0,capturedExpression_21,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::PPI
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>
              *)local_b0,chunk);
  rVar4 = ranges::
          view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:88:49)>_>,_(ranges::cardinality)-1>
          ::operator[]<true,_true,_0,_0>
                    ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>_>,_(ranges::cardinality)_1>
                      *)local_b0,0);
  bStack_6f = rVar4 == 1;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 1;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  local_58._0_4_ = rVar4;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xcc;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x13;
  capturedExpression_22.m_start = "2 == chunk.PPI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_b0,capturedExpression_22,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::PPI
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:88:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>)local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 2;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xcd;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x23;
  capturedExpression_23.m_start = "1 == chunk.particlePairNumbers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_b0,capturedExpression_23,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::PPI
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:88:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>)local_58 == 1;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 1;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xce;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x23;
  capturedExpression_24.m_start = "2 == chunk.particlePairNumbers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_b0,capturedExpression_24,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::PPI
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:88:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:88:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>)local_58 == 2;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 2;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xcf;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x11;
  capturedExpression_25.m_start = "0 == chunk.L()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_b0,capturedExpression_25,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::L
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:101:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>)local_58 == 0;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 0;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd0;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x11;
  capturedExpression_26.m_start = "1 == chunk.L()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_b0,capturedExpression_26,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::L
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:101:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,1);
  bStack_6f = (range_reference_t<D<true>_>)local_58 == 1;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 1;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd1;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x25;
  capturedExpression_27.m_start = "0 == chunk.orbitalMomentumValues()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_b0,capturedExpression_27,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::L
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>
              *)local_b0,chunk);
  local_58._0_4_ =
       ranges::
       view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:101:49)>_>,_(ranges::cardinality)-1>
       ::operator[]<true,_true,_0,_0>
                 ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>_>,_(ranges::cardinality)_1>
                   *)local_b0,0);
  bStack_6f = (range_reference_t<D<true>_>)local_58 == 0;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 0;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd2;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x25;
  capturedExpression_28.m_start = "1 == chunk.orbitalMomentumValues()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_b0,capturedExpression_28,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::L
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>
              *)local_b0,chunk);
  rVar4 = ranges::
          view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/151/RMatrixLimited/ResonanceChannels.hpp:101:49)>_>,_(ranges::cardinality)-1>
          ::operator[]<true,_true,_0,_0>
                    ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_ResonanceChannels_hpp:101:49)>_>,_(ranges::cardinality)_1>
                      *)local_b0,1);
  bStack_6f = rVar4 == 1;
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  uStack_6c = 1;
  local_68._M_current = (double *)0x17f7cd;
  local_60 = (WithinRelMatcher *)0x2;
  local_58 = CONCAT44(local_58._4_4_,rVar4);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd3;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x1f;
  capturedExpression_29.m_start = "0., WithinRel( chunk.SCH()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_b0,capturedExpression_29,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::SCH
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd4;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x1f;
  capturedExpression_30.m_start = ".5, WithinRel( chunk.SCH()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_b0,capturedExpression_30,
             ContinueOnFailure);
  local_100 = 0.5;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::SCH
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd5;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x2d;
  capturedExpression_31.m_start = "0., WithinRel( chunk.channelSpinValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_b0,capturedExpression_31,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::SCH
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd6;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x2d;
  capturedExpression_32.m_start = ".5, WithinRel( chunk.channelSpinValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_b0,capturedExpression_32,
             ContinueOnFailure);
  local_100 = 0.5;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::SCH
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd7;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x1f;
  capturedExpression_33.m_start = "0., WithinRel( chunk.BND()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_b0,capturedExpression_33,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::BND
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd8;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x1f;
  capturedExpression_34.m_start = "2., WithinRel( chunk.BND()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_b0,capturedExpression_34,
             ContinueOnFailure);
  local_100 = 2.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::BND
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xd9;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x33;
  capturedExpression_35.m_start = "0., WithinRel( chunk.boundaryConditionValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_b0,capturedExpression_35,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::BND
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xda;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x33;
  capturedExpression_36.m_start = "2., WithinRel( chunk.boundaryConditionValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_b0,capturedExpression_36,
             ContinueOnFailure);
  local_100 = 2.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::BND
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xdb;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x1f;
  capturedExpression_37.m_start = "0., WithinRel( chunk.APT()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_b0,capturedExpression_37,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APT
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xdc;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x28;
  capturedExpression_38.m_start = "5.437300e-1, WithinRel( chunk.APT()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_b0,capturedExpression_38,
             ContinueOnFailure);
  local_100 = 0.54373;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APT
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xdd;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x2c;
  capturedExpression_39.m_start = "0., WithinRel( chunk.trueChannelRadii()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_b0,capturedExpression_39,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APT
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xde;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x35;
  capturedExpression_40.m_start = "5.437300e-1, WithinRel( chunk.trueChannelRadii()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_b0,capturedExpression_40,
             ContinueOnFailure);
  local_100 = 0.54373;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APT
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xdf;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x1f;
  capturedExpression_41.m_start = "0., WithinRel( chunk.APE()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_b0,capturedExpression_41,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APE
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xe0;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x28;
  capturedExpression_42.m_start = "5.437310e-1, WithinRel( chunk.APE()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_b0,capturedExpression_42,
             ContinueOnFailure);
  local_100 = 0.543731;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APE
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xe1;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x31;
  capturedExpression_43.m_start = "0., WithinRel( chunk.effectiveChannelRadii()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_b0,capturedExpression_43,
             ContinueOnFailure);
  local_100 = 0.0;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APE
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xe2;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x3a;
  capturedExpression_44.m_start = "5.437310e-1, WithinRel( chunk.effectiveChannelRadii()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_44,(SourceLineInfo *)local_b0,capturedExpression_44,
             ContinueOnFailure);
  local_100 = 0.543731;
  njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::APE
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,chunk);
  pdVar6 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar6);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c92f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17e488;
  local_a8 = (pointer)0xe4;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0xf;
  capturedExpression_45.m_start = "3 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_45,(SourceLineInfo *)local_b0,capturedExpression_45,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_a8._4_4_ = 3;
  local_a0.rng_ = (vector<double,_std::allocator<double>_> *)0x17f7cd;
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const ResonanceChannels& chunk ) {

  CHECK_THAT( 0.5, WithinRel( chunk.AJ() ) );
  CHECK_THAT( 0.5, WithinRel( chunk.spin() ) );
  CHECK_THAT( 0., WithinRel( chunk.PJ() ) );
  CHECK_THAT( 0., WithinRel( chunk.parity() ) );
  CHECK( 0 == chunk.KBK() );
  CHECK( 0 == chunk.numberBackgroundChannels() );
  CHECK( 0 == chunk.KPS() );
  CHECK( 0 == chunk.phaseShiftOption() );
  CHECK( 2 == chunk.NCH() );
  CHECK( 2 == chunk.numberChannels() );

  CHECK( 2 == chunk.PPI().size() );
  CHECK( 2 == chunk.particlePairNumbers().size() );
  CHECK( 2 == chunk.L().size() );
  CHECK( 2 == chunk.orbitalMomentumValues().size() );
  CHECK( 2 == chunk.SCH().size() );
  CHECK( 2 == chunk.channelSpinValues().size() );
  CHECK( 2 == chunk.BND().size() );
  CHECK( 2 == chunk.boundaryConditionValues().size() );
  CHECK( 2 == chunk.APT().size() );
  CHECK( 2 == chunk.trueChannelRadii().size() );
  CHECK( 2 == chunk.APE().size() );
  CHECK( 2 == chunk.effectiveChannelRadii().size() );

  CHECK( 1 == chunk.PPI()[0] );
  CHECK( 2 == chunk.PPI()[1] );
  CHECK( 1 == chunk.particlePairNumbers()[0] );
  CHECK( 2 == chunk.particlePairNumbers()[1] );
  CHECK( 0 == chunk.L()[0] );
  CHECK( 1 == chunk.L()[1] );
  CHECK( 0 == chunk.orbitalMomentumValues()[0] );
  CHECK( 1 == chunk.orbitalMomentumValues()[1] );
  CHECK_THAT( 0., WithinRel( chunk.SCH()[0] ) );
  CHECK_THAT( .5, WithinRel( chunk.SCH()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.channelSpinValues()[0] ) );
  CHECK_THAT( .5, WithinRel( chunk.channelSpinValues()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.BND()[0] ) );
  CHECK_THAT( 2., WithinRel( chunk.BND()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.boundaryConditionValues()[0] ) );
  CHECK_THAT( 2., WithinRel( chunk.boundaryConditionValues()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.APT()[0] ) );
  CHECK_THAT( 5.437300e-1, WithinRel( chunk.APT()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.trueChannelRadii()[0] ) );
  CHECK_THAT( 5.437300e-1, WithinRel( chunk.trueChannelRadii()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.APE()[0] ) );
  CHECK_THAT( 5.437310e-1, WithinRel( chunk.APE()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.effectiveChannelRadii()[0] ) );
  CHECK_THAT( 5.437310e-1, WithinRel( chunk.effectiveChannelRadii()[1] ) );

  CHECK( 3 == chunk.NC() );
}